

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# char.c
# Opt level: O0

token * dmrC_get_string_constant(dmr_C *C,token *token,expression *expr)

{
  uint uVar1;
  char *end_00;
  uint local_2070;
  char *end;
  char *p;
  uint v;
  int esc_count;
  int bits;
  int len;
  char buffer [8191];
  uint local_40;
  int is_wide;
  int stringtype;
  token *done;
  token *next;
  string *string;
  expression *expr_local;
  token *token_local;
  dmr_C *C_local;
  
  next = (token *)(token->field_2).string;
  done = token->next;
  _is_wide = (expression *)0x0;
  local_40 = (uint)((SUB84(token->pos,0) & 0x3f) == 0x10);
  esc_count = 0;
  p._4_4_ = 0;
LAB_0010afa8:
  do {
    if (_is_wide != (expression *)0x0) {
      if (local_40 == 0) {
        local_2070 = C->target->bits_in_char;
      }
      else {
        local_2070 = C->target->bits_in_wchar;
      }
      v = local_2070;
      for (expr_local = (expression *)token; expr_local != _is_wide;
          expr_local = *(expression **)&expr_local->pos) {
        end = (char *)&expr_local->ctype->pos;
        end_00 = (char *)((long)end + (long)(int)(*(uint *)expr_local->ctype & 0x7fffffff) + -1);
        while (end < end_00) {
          if (*end == '\\') {
            p._4_4_ = p._4_4_ + 1;
          }
          end = parse_escape(C,end,(uint *)&p,end_00,v,*(position *)expr_local);
          if (esc_count < 0x1fff) {
            *(char *)((long)&bits + (long)esc_count) = (char)p._0_4_;
          }
          esc_count = esc_count + 1;
        }
      }
      if (0x1fff < esc_count) {
        dmrC_warning(C,*(position *)expr_local,
                     "trying to concatenate %d-character string (%d bytes max)",
                     (ulong)(uint)esc_count,0x1fff);
        esc_count = 0x1fff;
      }
      if ((p._4_4_ != 0) || ((int)(*(uint *)&next->pos & 0x7fffffff) <= esc_count)) {
        if ((*(int *)&next->pos < 0) || ((int)(*(uint *)&next->pos & 0x7fffffff) <= esc_count)) {
          next = (token *)dmrC_allocator_allocate(&C->string_allocator,(long)(esc_count + 1));
        }
        *(uint *)&next->pos = *(uint *)&next->pos & 0x80000000 | esc_count + 1U & 0x7fffffff;
        memcpy(&(next->pos).field_0x4,&bits,(long)esc_count);
        (&(next->pos).field_0x4)[esc_count] = 0;
      }
      (expr->field_5).field_2.string = (string *)next;
      (expr->field_5).field_2.wide = local_40;
      return (token *)expr_local;
    }
    uVar1 = *(uint *)&done->pos & 0x3f;
    if (uVar1 != 0xf) {
      if (uVar1 != 0x10) {
        _is_wide = (expression *)done;
        goto LAB_0010afa8;
      }
      local_40 = 1;
    }
    done = done->next;
  } while( true );
}

Assistant:

struct token *dmrC_get_string_constant(struct dmr_C *C, struct token *token, struct expression *expr)
{
	struct string *string = token->string;
	struct token *next = token->next, *done = NULL;
	int stringtype = dmrC_token_type(token);
	int is_wide = stringtype == TOKEN_WIDE_STRING;
	char buffer[MAX_STRING];
	int len = 0;
	int bits;
	int esc_count = 0;

	while (!done) {
		switch (dmrC_token_type(next)) {
		case TOKEN_WIDE_STRING:
			is_wide = 1;
		case TOKEN_STRING:
			next = next->next;
			break;
		default:
			done = next;
		}
	}
	bits = is_wide ? C->target->bits_in_wchar : C->target->bits_in_char;
	while (token != done) {
		unsigned v;
		const char *p = token->string->data;
		const char *end = p + token->string->length - 1;
		while (p < end) {
			if (*p == '\\')
				esc_count++;
			p = parse_escape(C, p, &v, end, bits, token->pos);
			if (len < MAX_STRING)
				buffer[len] = v;
			len++;
		}
		token = token->next;
	}
	if (len > MAX_STRING) {
		dmrC_warning(C, token->pos, "trying to concatenate %d-character string (%d bytes max)", len, MAX_STRING);
		len = MAX_STRING;
	}

	if (esc_count || len >= (int)string->length) {
		if (string->immutable || len >= string->length)	/* can't cannibalize */
			string = (struct string *)dmrC_allocator_allocate(&C->string_allocator, len+1);
		string->length = len+1;
		memcpy(string->data, buffer, len);
		string->data[len] = '\0';
	}
	expr->string = string;
	expr->wide = is_wide;
	return token;
}